

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

NFA * __thiscall re2::NFA::FormatCapture_abi_cxx11_(NFA *this,char **capture)

{
  long in_RDX;
  int local_28;
  int i;
  char **capture_local;
  NFA *this_local;
  string *s;
  
  std::__cxx11::string::string((string *)this);
  for (local_28 = 0; local_28 < *(int *)((long)capture + 0xc); local_28 = local_28 + 2) {
    if (*(long *)(in_RDX + (long)local_28 * 8) == 0) {
      StringAppendF((string *)this,"(?,?)");
    }
    else if (*(long *)(in_RDX + (long)(local_28 + 1) * 8) == 0) {
      StringAppendF((string *)this,"(%d,?)",
                    (ulong)(uint)(*(int *)(in_RDX + (long)local_28 * 8) - *(int *)(capture + 3)));
    }
    else {
      StringAppendF((string *)this,"(%d,%d)",
                    (ulong)(uint)(*(int *)(in_RDX + (long)local_28 * 8) - *(int *)(capture + 3)),
                    (ulong)(uint)(*(int *)(in_RDX + 8 + (long)local_28 * 8) - *(int *)(capture + 3))
                   );
    }
  }
  return this;
}

Assistant:

string NFA::FormatCapture(const char** capture) {
  string s;

  for (int i = 0; i < ncapture_; i+=2) {
    if (capture[i] == NULL)
      StringAppendF(&s, "(?,?)");
    else if (capture[i+1] == NULL)
      StringAppendF(&s, "(%d,?)", (int)(capture[i] - btext_));
    else
      StringAppendF(&s, "(%d,%d)",
                    (int)(capture[i] - btext_),
                    (int)(capture[i+1] - btext_));
  }
  return s;
}